

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_crc32.cc
# Opt level: O1

int __thiscall CCRC32::Get_CRC(CCRC32 *this,uchar *buffer,uint dwSize)

{
  uint uVar1;
  long lVar2;
  
  if (dwSize != 0) {
    uVar1 = 0xffffffff;
    lVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ this->crc32_table[(uint)buffer[lVar2] ^ uVar1 & 0xff];
      lVar2 = lVar2 + 1;
    } while (dwSize != (uint)lVar2);
    return ~uVar1;
  }
  return 0;
}

Assistant:

int CCRC32::Get_CRC(unsigned char* buffer, unsigned int dwSize)
{
	// Be sure to use unsigned variables,
	// because negative values introduce high bits
	// where zero bits are required.
	//unsigned long  crc(0xffffffff);
    unsigned int  crc(0xffffffff);
	int len;
	
	len = dwSize;	
	// Perform the algorithm on each character
	// in the string, using the lookup table values.
	while(len--)
		crc = (crc >> 8) ^ crc32_table[(crc & 0xFF) ^ *buffer++];
	// Exclusive OR the result with the beginning value.
	return crc^0xffffffff;
}